

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall BigInt::multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  BigInt *this_00;
  bool bVar1;
  bool bVar2;
  bool local_99;
  BigInt local_70;
  BigInt local_40;
  BigInt *local_20;
  BigInt *b_local;
  BigInt *this_local;
  BigInt *temp;
  
  local_20 = b;
  b_local = this;
  this_local = __return_storage_ptr__;
  BigInt(&local_40,0);
  bVar1 = operator==(this,&local_40);
  this_00 = local_20;
  local_99 = true;
  if (!bVar1) {
    BigInt(&local_70,0);
    local_99 = operator==(this_00,&local_70);
    ~BigInt(&local_70);
  }
  ~BigInt(&local_40);
  if (local_99 == false) {
    karatsuba(__return_storage_ptr__,this,this,local_20);
    get_real_length(__return_storage_ptr__);
    bVar1 = get_positive_sign(this);
    bVar2 = get_positive_sign(local_20);
    set_sign(__return_storage_ptr__,(bool)(-(bVar1 == bVar2) & 1));
  }
  else {
    BigInt(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    BigInt temp = this->karatsuba(*this, b);
    temp.get_real_length();
    temp.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    return temp;
}